

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

parser_error parse_player_timed_brand(parser *p)

{
  int iVar1;
  long *plVar2;
  char *__s1;
  uint local_2c;
  wchar_t idx;
  char *name;
  timed_effect_parse_state *ps;
  parser *p_local;
  
  plVar2 = (long *)parser_priv(p);
  __s1 = parser_getsym(p,"name");
  local_2c = (uint)z_info->brand_max;
  if (plVar2 != (long *)0x0) {
    if (*plVar2 == 0) {
      p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      if (__s1 != (char *)0x0) {
        local_2c = 1;
        while (((int)local_2c < (int)(uint)z_info->brand_max &&
               (iVar1 = strcmp(__s1,brands[(int)local_2c].code), iVar1 != 0))) {
          local_2c = local_2c + 1;
        }
      }
      if (local_2c == z_info->brand_max) {
        p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_BRAND;
      }
      else {
        *(uint *)(*plVar2 + 0x6c) = local_2c;
        p_local._4_4_ = PARSE_ERROR_NONE;
      }
    }
    return p_local._4_4_;
  }
  __assert_fail("ps",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                ,0x170,"enum parser_error parse_player_timed_brand(struct parser *)");
}

Assistant:

static enum parser_error parse_player_timed_brand(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	const char *name = parser_getsym(p, "name");
	int idx = z_info->brand_max;

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (name) {
		for (idx = 1; idx < z_info->brand_max; ++idx) {
			if (streq(name, brands[idx].code)) break;
		}
	}
	if (idx == z_info->brand_max) {
		return PARSE_ERROR_UNRECOGNISED_BRAND;
	}
	ps->t->temp_brand = idx;
	return PARSE_ERROR_NONE;
}